

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

bool __thiscall
Clasp::UncoreMinimize::handleUnsat(UncoreMinimize *this,Solver *s,bool up,LitVec *param_4)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  weight_t wVar4;
  const_iterator pLVar5;
  LitData *pLVar6;
  wsum_t wVar7;
  Solver *in_RCX;
  byte in_DL;
  Todo *in_RSI;
  Solver *in_RDI;
  undefined1 unaff_retaddr;
  Solver *in_stack_00000008;
  const_iterator it;
  uint32 cs;
  bool trimCore;
  Solver *in_stack_00000060;
  UncoreMinimize *in_stack_00000068;
  undefined4 in_stack_ffffffffffffffb8;
  uint32 in_stack_ffffffffffffffbc;
  Solver *in_stack_ffffffffffffffc8;
  uint32 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint at;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar2 = in_DL & 1;
  if (*(long *)&in_RDI->lower != 0) {
    DefaultMinimize::relaxBound
              ((DefaultMinimize *)(CONCAT17(in_DL,in_stack_ffffffffffffffe0) & 0x1ffffffffffffff),
               SUB81((ulong)in_RCX >> 0x38,0));
  }
  at = CONCAT13((*(uint *)((long)&(in_RDI->assign_).reason_.data_.ebo_.buf + 4) >> 5 & 7) != 0,
                (int3)in_stack_ffffffffffffffd4);
  do {
    if (((in_RDI->assign_).assign_.ebo_.cap >> 0x1c & 1) == 0) {
      bVar3 = Solver::hasStopConflict((Solver *)CONCAT44(at,in_stack_ffffffffffffffd0));
      if (bVar3) {
        return false;
      }
      bVar3 = Todo::shrink((Todo *)&in_RDI->shared_);
      if (bVar3) {
        wVar4 = Todo::weight((Todo *)&in_RDI->shared_);
        *(long *)&(in_RDI->assign_).trail.ebo_.size =
             *(long *)&(in_RDI->assign_).trail.ebo_.size - (long)wVar4;
        Todo::clear((Todo *)in_RDI,SUB41(in_stack_ffffffffffffffbc >> 0x18,0));
      }
      in_stack_ffffffffffffffd0 = analyze(in_stack_00000068,in_stack_00000060);
      if (in_stack_ffffffffffffffd0 == 0) {
        Todo::clear((Todo *)in_RDI,SUB41(in_stack_ffffffffffffffbc >> 0x18,0));
        return false;
      }
      wVar4 = Todo::weight((Todo *)&in_RDI->shared_);
      *(long *)&(in_RDI->assign_).trail.ebo_.size =
           (long)wVar4 + *(long *)&(in_RDI->assign_).trail.ebo_.size;
      if (((in_RDI->assign_).assign_.ebo_.cap >> 0x1d & 1) == 0) {
        if ((((at & 0x1000000) == 0) ||
            (bVar3 = validLowerBound((UncoreMinimize *)CONCAT44(at,in_stack_ffffffffffffffd0)),
            !bVar3)) ||
           (bVar3 = Todo::shrinkNext(in_RSI,(UncoreMinimize *)
                                            CONCAT17(bVar2,in_stack_ffffffffffffffe0),
                                     (ValueRep)((ulong)in_RCX >> 0x38)), !bVar3)) {
          resetTrim((UncoreMinimize *)CONCAT17(bVar2,in_stack_ffffffffffffffe0),in_RCX);
        }
        else {
          popPath((UncoreMinimize *)CONCAT44(at,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8
                  ,(uint32)((ulong)in_RDI >> 0x20));
        }
      }
      else {
        Todo::terminate((Todo *)CONCAT44(at,in_stack_ffffffffffffffd0));
        pLVar5 = Todo::end((Todo *)0x1b4430);
        for (in_stack_ffffffffffffffc8 =
                  (Solver *)(pLVar5 + -(ulong)(in_stack_ffffffffffffffd0 + 1));
            *(uint32 *)&in_stack_ffffffffffffffc8->field_0x4 != 0;
            in_stack_ffffffffffffffc8 = (Solver *)&in_stack_ffffffffffffffc8->model) {
          pLVar6 = getData((UncoreMinimize *)in_RDI,in_stack_ffffffffffffffbc);
          *(uint *)&pLVar6->field_0x4 = *(uint *)&pLVar6->field_0x4 & 0xbfffffff;
        }
      }
      bVar3 = validLowerBound((UncoreMinimize *)CONCAT44(at,in_stack_ffffffffffffffd0));
      (in_RDI->assign_).assign_.ebo_.cap =
           (in_RDI->assign_).assign_.ebo_.cap & 0xefffffff | (uint)((bVar3 ^ 0xffU) & 1) << 0x1c;
      if (((bVar2 & 1) != 0) &&
         (wVar7 = SharedMinimizeData::incLower
                            ((SharedMinimizeData *)in_RCX,at,(wsum_t)in_stack_ffffffffffffffc8),
         lVar1._0_4_ = (in_RDI->assign_).trail.ebo_.size,
         lVar1._4_4_ = (in_RDI->assign_).trail.ebo_.cap, wVar7 == lVar1)) {
        MinimizeConstraint::reportLower
                  ((MinimizeConstraint *)CONCAT44(at,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffc8,(uint32)((ulong)in_RDI >> 0x20),
                   CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      }
    }
    else {
      Solver::clearStopConflict(in_RDI);
      addNext((UncoreMinimize *)it,in_stack_00000008,(bool)unaff_retaddr);
    }
    in_stack_ffffffffffffffbc = CONCAT13(1,(int3)in_stack_ffffffffffffffbc);
    if (((in_RDI->assign_).assign_.ebo_.cap >> 0x1c & 1) == 0) {
      bVar3 = Solver::hasConflict((Solver *)0x1b45b5);
      in_stack_ffffffffffffffbc = CONCAT13(bVar3,(int3)in_stack_ffffffffffffffbc);
    }
    if ((char)(in_stack_ffffffffffffffbc >> 0x18) == '\0') {
      return true;
    }
  } while( true );
}

Assistant:

bool UncoreMinimize::handleUnsat(Solver& s, bool up, LitVec&) {
	assert(s.hasConflict());
	if (enum_) { enum_->relaxBound(true); }
	bool trimCore = options_.trim != 0u;
	do {
		if (next_ == 0) {
			if (s.hasStopConflict()) { return false; }
			if (todo_.shrink()) {
				lower_ -= todo_.weight();
				todo_.clear(false);
			}
			uint32 cs = analyze(s);
			if (!cs) {
				todo_.clear();
				return false;
			}
			lower_ += todo_.weight();
			if (disj_) { // preprocessing: remove assumptions and remember core
				todo_.terminate(); // null-terminate core
				for (Todo::const_iterator it = todo_.end() - (cs + 1); it->id; ++it) {
					getData(it->id).assume = 0;
				}
			}
			else if (trimCore && validLowerBound() && todo_.shrinkNext(*this, value_false)) {
				popPath(s, 0);
			}
			else {
				resetTrim(s);
			}
			next_ = !validLowerBound();
			if (up && shared_->incLower(level_, lower_) == lower_) {
				reportLower(s, level_, lower_);
			}
		}
		else {
			s.clearStopConflict();
			addNext(s);
		}
	} while (next_ || s.hasConflict());
	return true;
}